

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h.h
# Opt level: O1

void __thiscall
TPZGeoElRefLess<pzgeom::TPZGeoBlend<pzgeom::TPZGeoCube>_>::TPZGeoElRefLess
          (TPZGeoElRefLess<pzgeom::TPZGeoBlend<pzgeom::TPZGeoCube>_> *this,TPZVec<long> *nodeindices
          ,int matind,TPZGeoMesh *mesh,int64_t *index)

{
  long lVar1;
  
  *(undefined ***)&this->super_TPZGeoEl = &PTR__TPZSavable_018bde98;
  TPZGeoEl::TPZGeoEl(&this->super_TPZGeoEl,&PTR_PTR_018b8778,matind,mesh,index);
  *(undefined ***)&this->super_TPZGeoEl = &PTR__TPZGeoElRefLess_018b8478;
  pzgeom::TPZGeoBlend<pzgeom::TPZGeoCube>::TPZGeoBlend(&this->fGeo,nodeindices);
  lVar1 = 0x2300;
  do {
    *(undefined ***)
     ((long)(this->fGeo).super_TPZGeoCube.super_TPZNodeRep<8,_pztopology::TPZCube>.fNodeIndexes +
     lVar1 + -0x58) = &PTR__TPZGeoElSideIndex_018a3510;
    *(undefined4 *)
     ((long)(this->fGeo).super_TPZGeoCube.super_TPZNodeRep<8,_pztopology::TPZCube>.fNodeIndexes +
     lVar1 + -0x48) = 0xffffffff;
    *(undefined8 *)((long)(&(this->fGeo).super_TPZGeoCube + -1) + lVar1) = 0xffffffffffffffff;
    lVar1 = lVar1 + 0x18;
  } while (lVar1 != 0x2588);
  lVar1 = 0x2300;
  do {
    *(undefined8 *)((long)(&(this->fGeo).super_TPZGeoCube + -1) + lVar1) = 0xffffffffffffffff;
    *(undefined4 *)
     ((long)(this->fGeo).super_TPZGeoCube.super_TPZNodeRep<8,_pztopology::TPZCube>.fNodeIndexes +
     lVar1 + -0x48) = 0xffffffff;
    lVar1 = lVar1 + 0x18;
  } while (lVar1 != 0x2588);
  pzgeom::TPZGeoBlend<pzgeom::TPZGeoCube>::Initialize(&this->fGeo,&this->super_TPZGeoEl);
  return;
}

Assistant:

TPZGeoElRefLess<TGeo>::TPZGeoElRefLess(TPZVec<int64_t> &nodeindices,int matind,TPZGeoMesh &mesh, int64_t &index) 
: TPZRegisterClassId(&TPZGeoElRefLess<TGeo>::ClassId), TPZGeoEl(matind,mesh,index) , fGeo(nodeindices) 
{
	int i;
	for(i=0;i<TGeo::NSides;i++)fNeighbours[i] = TPZGeoElSideIndex();
    fGeo.Initialize(this);
}